

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O2

void __thiscall Simulator::var_real(Simulator *this,PCode *code)

{
  bool local_a9;
  double local_a8;
  Symbol local_a0;
  
  local_a8 = 0.0;
  local_a9 = false;
  Symbol::Symbol(&local_a0,&code->first_,&local_a8,&local_a9);
  ScopeTree::define(&this->tree_,&local_a0);
  Symbol::~Symbol(&local_a0);
  this->eip_ = this->eip_ + 1;
  return;
}

Assistant:

void Simulator::var_real(const PCode &code) {
    tree_.define(Symbol(code.first(), 0.0, false));
    inc_eip();
}